

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

void av1_zero_above_context
               (AV1_COMMON *cm,MACROBLOCKD *xd,int mi_col_start,int mi_col_end,int tile_row)

{
  SequenceHeader *pSVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  AV1_COMMON *in_RDI;
  int in_R8D;
  CommonContexts *above_contexts;
  int width_uv;
  int offset_uv;
  int width_y;
  int offset_y;
  int aligned_width;
  int width;
  int num_planes;
  SequenceHeader *seq_params;
  
  pSVar1 = in_RDI->seq_params;
  iVar2 = av1_num_planes(in_RDI);
  uVar3 = (in_ECX - in_EDX) + (1 << ((byte)pSVar1->mib_size_log2 & 0x1f)) + -1 &
          ((1 << ((byte)pSVar1->mib_size_log2 & 0x1f)) - 1U ^ 0xffffffff);
  iVar4 = in_EDX >> ((byte)pSVar1->subsampling_x & 0x1f);
  iVar5 = (int)uVar3 >> ((byte)pSVar1->subsampling_x & 0x1f);
  memset((in_RDI->above_contexts).entropy[0][in_R8D] + in_EDX,0,(long)(int)uVar3);
  if (1 < iVar2) {
    if (((in_RDI->above_contexts).entropy[1][in_R8D] == (ENTROPY_CONTEXT *)0x0) ||
       ((in_RDI->above_contexts).entropy[2][in_R8D] == (ENTROPY_CONTEXT *)0x0)) {
      aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x29f0),AOM_CODEC_CORRUPT_FRAME,
                         "Invalid value of planes");
    }
    else {
      memset((in_RDI->above_contexts).entropy[1][in_R8D] + iVar4,0,(long)iVar5);
      memset((in_RDI->above_contexts).entropy[2][in_R8D] + iVar4,0,(long)iVar5);
    }
  }
  memset((in_RDI->above_contexts).partition[in_R8D] + in_EDX,0,(long)(int)uVar3);
  memset((in_RDI->above_contexts).txfm[in_R8D] + in_EDX,0x40,(long)(int)uVar3);
  return;
}

Assistant:

static inline void av1_zero_above_context(AV1_COMMON *const cm,
                                          const MACROBLOCKD *xd,
                                          int mi_col_start, int mi_col_end,
                                          const int tile_row) {
  const SequenceHeader *const seq_params = cm->seq_params;
  const int num_planes = av1_num_planes(cm);
  const int width = mi_col_end - mi_col_start;
  const int aligned_width =
      ALIGN_POWER_OF_TWO(width, seq_params->mib_size_log2);
  const int offset_y = mi_col_start;
  const int width_y = aligned_width;
  const int offset_uv = offset_y >> seq_params->subsampling_x;
  const int width_uv = width_y >> seq_params->subsampling_x;
  CommonContexts *const above_contexts = &cm->above_contexts;

  av1_zero_array(above_contexts->entropy[0][tile_row] + offset_y, width_y);
  if (num_planes > 1) {
    if (above_contexts->entropy[1][tile_row] &&
        above_contexts->entropy[2][tile_row]) {
      av1_zero_array(above_contexts->entropy[1][tile_row] + offset_uv,
                     width_uv);
      av1_zero_array(above_contexts->entropy[2][tile_row] + offset_uv,
                     width_uv);
    } else {
      aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                         "Invalid value of planes");
    }
  }

  av1_zero_array(above_contexts->partition[tile_row] + mi_col_start,
                 aligned_width);

  memset(above_contexts->txfm[tile_row] + mi_col_start,
         tx_size_wide[TX_SIZES_LARGEST], aligned_width * sizeof(TXFM_CONTEXT));
}